

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::isolate
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this)

{
  bool bVar1;
  BBlock<dg::LLVMNode> *in_RDI;
  LLVMNode *in_stack_ffffffffffffffe8;
  
  removeDDs((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)in_RDI);
  removeUses((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)in_RDI);
  removeCDs((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)in_RDI);
  if (*(long *)&(in_RDI->callSites)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    BBlock<dg::LLVMNode>::removeNode(in_RDI,in_stack_ffffffffffffffe8);
    bVar1 = BBlock<dg::LLVMNode>::empty((BBlock<dg::LLVMNode> *)0x1b27dd);
    if (bVar1) {
      BBlock<dg::LLVMNode>::remove
                (*(BBlock<dg::LLVMNode> **)
                  &(in_RDI->callSites)._M_t._M_impl.super__Rb_tree_header._M_header,(char *)0x1);
    }
    bVar1 = hasSubgraphs((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)0x1b2803);
    if (bVar1) {
      BBlock<dg::LLVMNode>::removeCallSite(in_RDI,in_stack_ffffffffffffffe8);
    }
    *(undefined8 *)&(in_RDI->callSites)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  return;
}

Assistant:

void isolate() {
        // remove CD and DD and uses from this node
        removeDDs();
        removeUses();
        removeCDs();

#ifdef ENABLE_CFG
        // if this is head or tail of BB,
        // we must take it into account
        if (basicBlock) {
            // XXX removing the node from BB is in linear time,
            // could we do it better?
            basicBlock->removeNode(static_cast<NodeT *>(this));

            // if this was the only node in BB, remove the BB
            if (basicBlock->empty())
                basicBlock->remove();

            // if this is a callSite it is no longer part of BBlock,
            // so we must remove it from callSites
            if (hasSubgraphs()) {
#ifndef NDEBUG
                bool ret =
#endif
                        basicBlock->removeCallSite(static_cast<NodeT *>(this));
                assert(ret && "the call site was not in BB's callSites");
            }

            basicBlock = nullptr;
        }
#endif
    }